

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyBlobSearch(void *pBlob,sxu32 nLen,void *pPattern,sxu32 pLen,sxu32 *pOfft)

{
  sxu32 sVar1;
  sxu32 sVar2;
  sxu32 sVar3;
  void *pvVar4;
  char cVar5;
  void *pvVar6;
  int iVar7;
  char *zIn;
  char cVar8;
  sxu32 sVar9;
  long lVar10;
  
  iVar7 = (int)pBlob;
  if (pLen <= nLen) {
    pvVar6 = (void *)((ulong)(nLen - pLen) + (long)pBlob);
    sVar1 = pLen - 3;
    sVar2 = pLen - 2;
    sVar3 = pLen - 1;
    for (; pBlob <= pvVar6; pBlob = (void *)((long)pBlob + 4)) {
      lVar10 = 0;
      while( true ) {
        sVar9 = (sxu32)lVar10;
        pvVar4 = pBlob;
        if (pLen == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10);
        cVar8 = *(char *)((long)pPattern + lVar10);
        if (cVar5 != cVar8) break;
        if (sVar3 == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 1);
        cVar8 = *(char *)((long)pPattern + lVar10 + 1);
        if (cVar5 != cVar8) break;
        if (sVar2 == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 2);
        cVar8 = *(char *)((long)pPattern + lVar10 + 2);
        if (cVar5 != cVar8) break;
        if (sVar1 == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 3);
        cVar8 = *(char *)((long)pPattern + lVar10 + 3);
        if (cVar5 != cVar8) break;
        lVar10 = lVar10 + 4;
      }
      if (cVar5 == cVar8) {
LAB_0012f236:
        if (pOfft != (sxu32 *)0x0) {
          *pOfft = (int)pvVar4 - iVar7;
        }
        return 0;
      }
      pvVar4 = (void *)((long)pBlob + 1);
      if (pvVar6 < pvVar4) {
        return -6;
      }
      lVar10 = 0;
      while( true ) {
        sVar9 = (sxu32)lVar10;
        if (pLen == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 1);
        cVar8 = *(char *)((long)pPattern + lVar10);
        if (cVar5 != cVar8) break;
        if (sVar3 == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 2);
        cVar8 = *(char *)((long)pPattern + lVar10 + 1);
        if (cVar5 != cVar8) break;
        if (sVar2 == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 3);
        cVar8 = *(char *)((long)pPattern + lVar10 + 2);
        if (cVar5 != cVar8) break;
        if (sVar1 == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 4);
        cVar8 = *(char *)((long)pPattern + lVar10 + 3);
        if (cVar5 != cVar8) break;
        lVar10 = lVar10 + 4;
      }
      if (cVar5 == cVar8) goto LAB_0012f236;
      pvVar4 = (void *)((long)pBlob + 2);
      if (pvVar6 < pvVar4) {
        return -6;
      }
      lVar10 = 0;
      while( true ) {
        sVar9 = (sxu32)lVar10;
        if (pLen == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 2);
        cVar8 = *(char *)((long)pPattern + lVar10);
        if (cVar5 != cVar8) break;
        if (sVar3 == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 3);
        cVar8 = *(char *)((long)pPattern + lVar10 + 1);
        if (cVar5 != cVar8) break;
        if (sVar2 == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 4);
        cVar8 = *(char *)((long)pPattern + lVar10 + 2);
        if (cVar5 != cVar8) break;
        if (sVar1 == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 5);
        cVar8 = *(char *)((long)pPattern + lVar10 + 3);
        if (cVar5 != cVar8) break;
        lVar10 = lVar10 + 4;
      }
      if (cVar5 == cVar8) goto LAB_0012f236;
      pvVar4 = (void *)((long)pBlob + 3);
      if (pvVar6 < pvVar4) {
        return -6;
      }
      lVar10 = 0;
      while( true ) {
        sVar9 = (sxu32)lVar10;
        if (pLen == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 3);
        cVar8 = *(char *)((long)pPattern + lVar10);
        if (cVar5 != cVar8) break;
        if (sVar3 == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 4);
        cVar8 = *(char *)((long)pPattern + lVar10 + 1);
        if (cVar5 != cVar8) break;
        if (sVar2 == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 5);
        cVar8 = *(char *)((long)pPattern + lVar10 + 2);
        if (cVar5 != cVar8) break;
        if (sVar1 == sVar9) goto LAB_0012f236;
        cVar5 = *(char *)((long)pBlob + lVar10 + 6);
        cVar8 = *(char *)((long)pPattern + lVar10 + 3);
        if (cVar5 != cVar8) break;
        lVar10 = lVar10 + 4;
      }
      if (cVar5 == cVar8) goto LAB_0012f236;
    }
  }
  return -6;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobSearch(const void *pBlob, sxu32 nLen, const void *pPattern, sxu32 pLen, sxu32 *pOfft)
{
	const char *zIn = (const char *)pBlob;
	const char *zEnd;
	sxi32 rc;
	if( pLen > nLen ){
		return SXERR_NOTFOUND;
	}
	zEnd = &zIn[nLen-pLen];
	for(;;){
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
		if( zIn > zEnd ){break;} SX_MACRO_FAST_CMP(zIn, pPattern, pLen, rc); if( rc == 0 ){ if( pOfft ){ *pOfft = (sxu32)(zIn - (const char *)pBlob);} return SXRET_OK; } zIn++;
	}
	return SXERR_NOTFOUND;
}